

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo
          (Delimited<kj::ArrayPtr<const_unsigned_char>_> *this,char *target)

{
  bool bVar1;
  long lVar2;
  CappedArray<char,_5UL> *elem;
  CappedArray<char,_5UL> *first;
  
  ensureStringifiedInitialized(this);
  first = (this->stringified).ptr;
  bVar1 = true;
  for (lVar2 = (this->stringified).size_ << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    if (!bVar1) {
      target = fill<kj::StringPtr>(target,&this->delimiter);
    }
    target = fill<kj::CappedArray<char,5ul>>(target,first);
    first = first + 1;
    bVar1 = false;
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }